

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathFuncs.cpp
# Opt level: O2

float grow(float x,int y)

{
  int iVar1;
  ostream *poVar2;
  bool bVar3;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"grow (");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,x);
  poVar2 = std::operator<<(poVar2,", ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,y);
  poVar2 = std::operator<<(poVar2,")");
  std::endl<char,std::char_traits<char>>(poVar2);
  iVar1 = 0;
  if (0 < y) {
    iVar1 = y;
  }
  while (bVar3 = iVar1 != 0, iVar1 = iVar1 + -1, bVar3) {
    x = x * x;
  }
  return x;
}

Assistant:

float
grow (float x, int y)
{
    std::cout << "grow (" << x << ", " << y << ")" << std::endl;

    for (int i = 0; i < y; i++)
	x = x * x;

    return x;
}